

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall adios2sys::RegExpCompile::reg(RegExpCompile *this,int paren,int *flagp)

{
  char *pcVar1;
  int iVar2;
  RegExpCompile *this_00;
  RegExpCompile *flagp_00;
  RegExpCompile *this_01;
  uint *in_RDX;
  int in_ESI;
  RegExpCompile *in_RDI;
  int flags;
  int parno;
  char *ender;
  char *br;
  char *ret;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffc0;
  int iVar3;
  int *in_stack_ffffffffffffffd0;
  RegExpCompile *local_8;
  
  iVar3 = 0;
  *in_RDX = 1;
  if (in_ESI == 0) {
    this_00 = (RegExpCompile *)0x0;
  }
  else {
    if (0x1f < in_RDI->regnpar) {
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return (char *)0x0;
    }
    iVar3 = in_RDI->regnpar;
    in_RDI->regnpar = in_RDI->regnpar + 1;
    this_00 = (RegExpCompile *)regnode(in_RDI,(char)iVar3 + '\x14');
  }
  flagp_00 = (RegExpCompile *)regbranch(this_00,in_stack_ffffffffffffffd0);
  if (flagp_00 == (RegExpCompile *)0x0) {
    local_8 = (RegExpCompile *)0x0;
  }
  else {
    this_01 = flagp_00;
    if (this_00 != (RegExpCompile *)0x0) {
      regtail((char *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),(char *)in_RDI);
      this_01 = this_00;
    }
    if ((in_stack_ffffffffffffffc0 & 1) == 0) {
      *in_RDX = *in_RDX & 0xfffffffe;
    }
    *in_RDX = in_stack_ffffffffffffffc0 & 4 | *in_RDX;
    while (*in_RDI->regparse == '|') {
      in_RDI->regparse = in_RDI->regparse + 1;
      flagp_00 = (RegExpCompile *)regbranch(this_01,(int *)flagp_00);
      if (flagp_00 == (RegExpCompile *)0x0) {
        return (char *)0x0;
      }
      regtail((char *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),(char *)in_RDI);
      if ((in_stack_ffffffffffffffc0 & 1) == 0) {
        *in_RDX = *in_RDX & 0xfffffffe;
      }
      *in_RDX = in_stack_ffffffffffffffc0 & 4 | *in_RDX;
    }
    if (in_ESI == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = iVar3 + 0x34;
    }
    regnode(in_RDI,(char)iVar2);
    regtail((char *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),(char *)in_RDI);
    local_8 = this_01;
    for (; this_01 != (RegExpCompile *)0x0; this_01 = (RegExpCompile *)regnext((char *)this_01)) {
      regoptail((char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8);
    }
    if ((in_ESI == 0) || (pcVar1 = in_RDI->regparse, in_RDI->regparse = pcVar1 + 1, *pcVar1 == ')'))
    {
      if ((in_ESI == 0) && (*in_RDI->regparse != '\0')) {
        if (*in_RDI->regparse == ')') {
          printf("RegularExpression::compile(): Unmatched parentheses.\n");
          local_8 = (RegExpCompile *)0x0;
        }
        else {
          printf("RegularExpression::compile(): Internal error.\n");
          local_8 = (RegExpCompile *)0x0;
        }
      }
    }
    else {
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      local_8 = (RegExpCompile *)0x0;
    }
  }
  return (char *)local_8;
}

Assistant:

char* RegExpCompile::reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpressionMatch::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return nullptr;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = nullptr;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (!br)
    return (nullptr);
  if (ret)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (!br)
      return (nullptr);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return nullptr;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return nullptr;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return nullptr;
    }
    // NOTREACHED
  }
  return (ret);
}